

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder_internal.h
# Opt level: O0

int __thiscall basist::huffman_decoding_table::init(huffman_decoding_table *this,EVP_PKEY_CTX *ctx)

{
  byte bVar1;
  uint32_t uVar2;
  int *extraout_RAX;
  uchar *__dest;
  int *piVar3;
  uint *puVar4;
  short *psVar5;
  uint in_ECX;
  void *in_RDX;
  int idx;
  int idx_2;
  int j;
  uint32_t idx_1;
  int tree_cur;
  uint32_t k;
  uint32_t code_size;
  uint32_t cur_code;
  uint32_t l;
  uint32_t rev_code;
  int sym_index;
  int tree_next;
  uint32_t i_1;
  uint32_t total;
  uint32_t used_syms;
  uint32_t next_code [32];
  uint32_t i;
  uint32_t syms_using_codesize [32];
  uint32_t huffman_fast_lookup_size;
  undefined2 in_stack_fffffffffffffe68;
  short in_stack_fffffffffffffe6a;
  uint in_stack_fffffffffffffe6c;
  undefined2 in_stack_fffffffffffffe70;
  short in_stack_fffffffffffffe72;
  uint in_stack_fffffffffffffe74;
  uint in_stack_fffffffffffffe78;
  uint in_stack_fffffffffffffe7c;
  uint local_16c;
  uint local_164;
  uint local_158;
  uint local_154;
  uint local_150;
  uint local_14c;
  uint local_148;
  uint local_144;
  uint local_140;
  uint local_13c;
  uint local_138 [35];
  uint local_ac;
  int local_a8 [32];
  uint local_28;
  uint local_24;
  void *local_20;
  uint local_14;
  huffman_decoding_table *local_10;
  undefined1 local_1;
  
  local_14 = (uint)ctx;
  local_10 = this;
  if (local_14 == 0) {
    clear((huffman_decoding_table *)
          CONCAT44(in_stack_fffffffffffffe74,
                   CONCAT22(in_stack_fffffffffffffe72,in_stack_fffffffffffffe70)));
    local_1 = 1;
    piVar3 = extraout_RAX;
  }
  else {
    local_24 = in_ECX;
    local_20 = in_RDX;
    basisu::vector<unsigned_char>::resize
              (&this->m_code_sizes,CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
               SUB41(in_stack_fffffffffffffe74 >> 0x18,0));
    __dest = basisu::vector<unsigned_char>::operator[]
                       ((vector<unsigned_char> *)
                        CONCAT44(in_stack_fffffffffffffe74,
                                 CONCAT22(in_stack_fffffffffffffe72,in_stack_fffffffffffffe70)),
                        CONCAT44(in_stack_fffffffffffffe6c,
                                 CONCAT22(in_stack_fffffffffffffe6a,in_stack_fffffffffffffe68)));
    memcpy(__dest,local_20,(ulong)local_14);
    local_28 = 1 << ((byte)local_24 & 0x1f);
    basisu::vector<int>::resize
              ((vector<int> *)this,CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
               SUB41(in_stack_fffffffffffffe74 >> 0x18,0));
    basisu::vector<int>::resize
              ((vector<int> *)this,CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
               SUB41(in_stack_fffffffffffffe74 >> 0x18,0));
    basisu::vector<short>::resize
              ((vector<short> *)this,CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
               SUB41(in_stack_fffffffffffffe74 >> 0x18,0));
    basisu::vector<short>::resize
              ((vector<short> *)this,CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
               SUB41(in_stack_fffffffffffffe74 >> 0x18,0));
    basisu::clear_obj<unsigned_int[32]>((uint (*) [32])0x1651af);
    for (local_ac = 0; local_ac < local_14; local_ac = local_ac + 1) {
      piVar3 = (int *)0x0;
      if (0x1f < *(byte *)((long)local_20 + (ulong)local_ac)) {
        local_1 = 0;
        goto LAB_0016569b;
      }
      local_a8[*(byte *)((long)local_20 + (ulong)local_ac)] =
           local_a8[*(byte *)((long)local_20 + (ulong)local_ac)] + 1;
    }
    local_138[1] = 0;
    local_138[0] = 0;
    local_13c = 0;
    local_140 = 0;
    for (local_144 = 1; local_144 < 0x1f; local_144 = local_144 + 1) {
      local_13c = local_a8[local_144] + local_13c;
      local_140 = (local_140 + local_a8[local_144]) * 2;
      local_138[local_144 + 1] = local_140;
    }
    piVar3 = (int *)0x80000000;
    if ((local_140 == 0x80000000) || (local_13c < 2)) {
      local_148 = 0xffffffff;
      for (local_14c = 0; piVar3 = (int *)(ulong)local_14c, (int)local_14c < (int)local_14;
          local_14c = local_14c + 1) {
        local_150 = 0;
        bVar1 = *(byte *)((long)local_20 + (long)(int)local_14c);
        local_16c = (uint)bVar1;
        if (local_16c != 0) {
          local_158 = local_138[local_16c];
          local_138[local_16c] = local_158 + 1;
          for (local_154 = local_16c; local_154 != 0; local_154 = local_154 - 1) {
            local_150 = local_150 << 1 | local_158 & 1;
            local_158 = local_158 >> 1;
          }
          if (local_24 < local_16c) {
            puVar4 = (uint *)basisu::vector<int>::operator[]
                                       ((vector<int> *)
                                        CONCAT44(in_stack_fffffffffffffe74,
                                                 CONCAT22(in_stack_fffffffffffffe72,
                                                          in_stack_fffffffffffffe70)),
                                        CONCAT44(in_stack_fffffffffffffe6c,
                                                 CONCAT22(in_stack_fffffffffffffe6a,
                                                          in_stack_fffffffffffffe68)));
            local_164 = *puVar4;
            piVar3 = (int *)0x0;
            if (local_164 == 0) {
              piVar3 = basisu::vector<int>::operator[]
                                 ((vector<int> *)
                                  CONCAT44(in_stack_fffffffffffffe74,
                                           CONCAT22(in_stack_fffffffffffffe72,
                                                    in_stack_fffffffffffffe70)),
                                  CONCAT44(in_stack_fffffffffffffe6c,
                                           CONCAT22(in_stack_fffffffffffffe6a,
                                                    in_stack_fffffffffffffe68)));
              if (*piVar3 != 0) {
                local_1 = 0;
                goto LAB_0016569b;
              }
              in_stack_fffffffffffffe78 = local_148;
              puVar4 = (uint *)basisu::vector<int>::operator[]
                                         ((vector<int> *)
                                          CONCAT44(in_stack_fffffffffffffe74,
                                                   CONCAT22(in_stack_fffffffffffffe72,
                                                            in_stack_fffffffffffffe70)),
                                          CONCAT44(in_stack_fffffffffffffe6c,
                                                   CONCAT22(in_stack_fffffffffffffe6a,
                                                            in_stack_fffffffffffffe68)));
              *puVar4 = in_stack_fffffffffffffe78;
              local_164 = local_148;
              local_148 = local_148 - 2;
              piVar3 = (int *)(ulong)local_148;
            }
            if (-1 < (int)local_164) {
              local_1 = 0;
              goto LAB_0016569b;
            }
            local_150 = local_150 >> ((char)local_24 - 1U & 0x1f);
            for (; (int)(local_24 + 1) < (int)local_16c; local_16c = local_16c - 1) {
              local_150 = local_150 >> 1;
              in_stack_fffffffffffffe74 = 0xffffffff - (local_164 - (local_150 & 1));
              piVar3 = (int *)(ulong)in_stack_fffffffffffffe74;
              if ((int)in_stack_fffffffffffffe74 < 0) {
                local_1 = 0;
                goto LAB_0016569b;
              }
              uVar2 = basisu::vector<short>::size(&this->m_tree);
              if ((int)uVar2 <= (int)in_stack_fffffffffffffe74) {
                basisu::vector<short>::resize
                          ((vector<short> *)this,
                           CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                           SUB41(in_stack_fffffffffffffe74 >> 0x18,0));
              }
              psVar5 = basisu::vector<short>::operator[]
                                 ((vector<short> *)
                                  CONCAT44(in_stack_fffffffffffffe74,
                                           CONCAT22(in_stack_fffffffffffffe72,
                                                    in_stack_fffffffffffffe70)),
                                  CONCAT44(in_stack_fffffffffffffe6c,
                                           CONCAT22(in_stack_fffffffffffffe6a,
                                                    in_stack_fffffffffffffe68)));
              if (*psVar5 == 0) {
                in_stack_fffffffffffffe72 = (short)local_148;
                psVar5 = basisu::vector<short>::operator[]
                                   ((vector<short> *)
                                    CONCAT44(in_stack_fffffffffffffe74,
                                             CONCAT22(in_stack_fffffffffffffe72,
                                                      in_stack_fffffffffffffe70)),
                                    CONCAT44(in_stack_fffffffffffffe6c,
                                             CONCAT22(in_stack_fffffffffffffe6a,
                                                      in_stack_fffffffffffffe68)));
                *psVar5 = in_stack_fffffffffffffe72;
                local_164 = local_148;
                local_148 = local_148 - 2;
              }
              else {
                psVar5 = basisu::vector<short>::operator[]
                                   ((vector<short> *)
                                    CONCAT44(in_stack_fffffffffffffe74,
                                             CONCAT22(in_stack_fffffffffffffe72,
                                                      in_stack_fffffffffffffe70)),
                                    CONCAT44(in_stack_fffffffffffffe6c,
                                             CONCAT22(in_stack_fffffffffffffe6a,
                                                      in_stack_fffffffffffffe68)));
                local_164 = (uint)*psVar5;
                piVar3 = (int *)(ulong)local_164;
                if (-1 < (int)local_164) {
                  local_1 = 0;
                  goto LAB_0016569b;
                }
              }
            }
            in_stack_fffffffffffffe6c = 0xffffffff - (local_164 - (local_150 >> 1 & 1));
            piVar3 = (int *)(ulong)in_stack_fffffffffffffe6c;
            if ((int)in_stack_fffffffffffffe6c < 0) {
              local_1 = 0;
              goto LAB_0016569b;
            }
            uVar2 = basisu::vector<short>::size(&this->m_tree);
            if ((int)uVar2 <= (int)in_stack_fffffffffffffe6c) {
              basisu::vector<short>::resize
                        ((vector<short> *)this,
                         CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                         SUB41(in_stack_fffffffffffffe74 >> 0x18,0));
            }
            psVar5 = basisu::vector<short>::operator[]
                               ((vector<short> *)
                                CONCAT44(in_stack_fffffffffffffe74,
                                         CONCAT22(in_stack_fffffffffffffe72,
                                                  in_stack_fffffffffffffe70)),
                                CONCAT44(in_stack_fffffffffffffe6c,
                                         CONCAT22(in_stack_fffffffffffffe6a,
                                                  in_stack_fffffffffffffe68)));
            piVar3 = (int *)(ulong)(uint)(int)*psVar5;
            if ((int)*psVar5 != 0) {
              local_1 = 0;
              goto LAB_0016569b;
            }
            in_stack_fffffffffffffe6a = (short)local_14c;
            psVar5 = basisu::vector<short>::operator[]
                               ((vector<short> *)
                                CONCAT44(in_stack_fffffffffffffe74,
                                         CONCAT22(in_stack_fffffffffffffe72,
                                                  in_stack_fffffffffffffe70)),
                                CONCAT44(in_stack_fffffffffffffe6c,
                                         CONCAT22(in_stack_fffffffffffffe6a,
                                                  in_stack_fffffffffffffe68)));
            *psVar5 = in_stack_fffffffffffffe6a;
          }
          else {
            for (; local_150 < local_28; local_150 = (1 << (bVar1 & 0x1f)) + local_150) {
              piVar3 = basisu::vector<int>::operator[]
                                 ((vector<int> *)
                                  CONCAT44(in_stack_fffffffffffffe74,
                                           CONCAT22(in_stack_fffffffffffffe72,
                                                    in_stack_fffffffffffffe70)),
                                  CONCAT44(in_stack_fffffffffffffe6c,
                                           CONCAT22(in_stack_fffffffffffffe6a,
                                                    in_stack_fffffffffffffe68)));
              if (*piVar3 != 0) {
                local_1 = 0;
                goto LAB_0016569b;
              }
              in_stack_fffffffffffffe7c = local_16c << 0x10 | local_14c;
              puVar4 = (uint *)basisu::vector<int>::operator[]
                                         ((vector<int> *)
                                          CONCAT44(in_stack_fffffffffffffe74,
                                                   CONCAT22(in_stack_fffffffffffffe72,
                                                            in_stack_fffffffffffffe70)),
                                          CONCAT44(in_stack_fffffffffffffe6c,
                                                   CONCAT22(in_stack_fffffffffffffe6a,
                                                            in_stack_fffffffffffffe68)));
              *puVar4 = in_stack_fffffffffffffe7c;
            }
          }
        }
      }
      local_1 = 1;
    }
    else {
      local_1 = 0;
    }
  }
LAB_0016569b:
  return (int)CONCAT71((int7)((ulong)piVar3 >> 8),local_1);
}

Assistant:

bool init(uint32_t total_syms, const uint8_t *pCode_sizes, uint32_t fast_lookup_bits = basisu::cHuffmanFastLookupBits)
		{
			if (!total_syms)
			{
				clear();
				return true;
			}

			m_code_sizes.resize(total_syms);
			memcpy(&m_code_sizes[0], pCode_sizes, total_syms);

			const uint32_t huffman_fast_lookup_size = 1 << fast_lookup_bits;

			m_lookup.resize(0);
			m_lookup.resize(huffman_fast_lookup_size);

			m_tree.resize(0);
			m_tree.resize(total_syms * 2);

			uint32_t syms_using_codesize[basisu::cHuffmanMaxSupportedInternalCodeSize + 1];
			basisu::clear_obj(syms_using_codesize);
			for (uint32_t i = 0; i < total_syms; i++)
			{
				if (pCode_sizes[i] > basisu::cHuffmanMaxSupportedInternalCodeSize)
					return false;
				syms_using_codesize[pCode_sizes[i]]++;
			}

			uint32_t next_code[basisu::cHuffmanMaxSupportedInternalCodeSize + 1];
			next_code[0] = next_code[1] = 0;

			uint32_t used_syms = 0, total = 0;
			for (uint32_t i = 1; i < basisu::cHuffmanMaxSupportedInternalCodeSize; i++)
			{
				used_syms += syms_using_codesize[i];
				next_code[i + 1] = (total = ((total + syms_using_codesize[i]) << 1));
			}

			if (((1U << basisu::cHuffmanMaxSupportedInternalCodeSize) != total) && (used_syms > 1U))
				return false;

			for (int tree_next = -1, sym_index = 0; sym_index < (int)total_syms; ++sym_index)
			{
				uint32_t rev_code = 0, l, cur_code, code_size = pCode_sizes[sym_index];
				if (!code_size)
					continue;

				cur_code = next_code[code_size]++;

				for (l = code_size; l > 0; l--, cur_code >>= 1)
					rev_code = (rev_code << 1) | (cur_code & 1);

				if (code_size <= fast_lookup_bits)
				{
					uint32_t k = (code_size << 16) | sym_index;
					while (rev_code < huffman_fast_lookup_size)
					{
						if (m_lookup[rev_code] != 0)
						{
							// Supplied codesizes can't create a valid prefix code.
							return false;
						}

						m_lookup[rev_code] = k;
						rev_code += (1 << code_size);
					}
					continue;
				}

				int tree_cur;
				if (0 == (tree_cur = m_lookup[rev_code & (huffman_fast_lookup_size - 1)]))
				{
					const uint32_t idx = rev_code & (huffman_fast_lookup_size - 1);
					if (m_lookup[idx] != 0)
					{
						// Supplied codesizes can't create a valid prefix code.
						return false;
					}

					m_lookup[idx] = tree_next;
					tree_cur = tree_next;
					tree_next -= 2;
				}

				if (tree_cur >= 0)
				{
					// Supplied codesizes can't create a valid prefix code.
					return false;
				}

				rev_code >>= (fast_lookup_bits - 1);

				for (int j = code_size; j > ((int)fast_lookup_bits + 1); j--)
				{
					tree_cur -= ((rev_code >>= 1) & 1);

					const int idx = -tree_cur - 1;
					if (idx < 0)
						return false;
					else if (idx >= (int)m_tree.size())
						m_tree.resize(idx + 1);
										
					if (!m_tree[idx])
					{
						m_tree[idx] = (int16_t)tree_next;
						tree_cur = tree_next;
						tree_next -= 2;
					}
					else
					{
						tree_cur = m_tree[idx];
						if (tree_cur >= 0)
						{
							// Supplied codesizes can't create a valid prefix code.
							return false;
						}
					}
				}

				tree_cur -= ((rev_code >>= 1) & 1);

				const int idx = -tree_cur - 1;
				if (idx < 0)
					return false;
				else if (idx >= (int)m_tree.size())
					m_tree.resize(idx + 1);

				if (m_tree[idx] != 0)
				{
					// Supplied codesizes can't create a valid prefix code.
					return false;
				}

				m_tree[idx] = (int16_t)sym_index;
			}

			return true;
		}